

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

void __thiscall
aeron::archive::AeronArchive::stopRecording(AeronArchive *this,int64_t subscriptionId)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  int64_t local_10;
  
  local_38._8_8_ = &local_10;
  pcStack_20 = std::
               _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:194:9)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<bool_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/src/AeronArchive.cpp:194:9)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  local_10 = subscriptionId;
  callAndPollForResponse(this,(function<bool_(long)> *)&local_38,"stop recording");
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return;
}

Assistant:

void AeronArchive::stopRecording(std::int64_t subscriptionId) {
    callAndPollForResponse(
        [&](std::int64_t correlationId) {
            return this->archiveProxy_->stopRecording(subscriptionId, correlationId, controlSessionId_);
        },
        "stop recording");
}